

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::BaseRAPass::buildLiveness(BaseRAPass *this)

{
  uint *puVar1;
  int *piVar2;
  ulong *puVar3;
  long *plVar4;
  FormatFlags FVar5;
  FuncNode *pFVar6;
  ArchTraits *pAVar7;
  FuncPass *pFVar8;
  bool bVar9;
  byte bVar10;
  Error EVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  BaseNode *pBVar15;
  BaseRAPass *pBVar16;
  BaseRAPass *pBVar17;
  undefined1 *puVar18;
  undefined4 extraout_var;
  byte bVar19;
  char c;
  _func_int *p_Var20;
  BaseNode *pBVar21;
  char *pcVar22;
  BaseRAPass *pBVar23;
  long *plVar24;
  long lVar25;
  int iVar26;
  BaseBuilder *pBVar27;
  uint *puVar28;
  char *this_00;
  BaseRAPass *pBVar29;
  RegGroup group;
  BaseRAPass *pBVar30;
  uint uVar31;
  BaseRAPass *pBVar32;
  uint32_t *puVar33;
  uint uVar34;
  BaseRAPass *this_01;
  long lVar35;
  BaseNode **ppBVar36;
  ulong uVar37;
  ulong uVar38;
  uint32_t newSize;
  BaseRAPass *pBVar39;
  long lVar40;
  uint uVar41;
  BaseRAPass *pBVar42;
  float fVar43;
  float __x;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  ZoneStack<asmjit::v1_14::RABlock_*> workList;
  ZoneVector<unsigned_int> nInstsPerBlock;
  ZoneVector<unsigned_int> nOutsPerWorkReg;
  ZoneVector<unsigned_int> nUsesPerWorkReg;
  undefined1 auStack_7d8 [32];
  undefined1 auStack_7b8 [1032];
  BaseRAPass *pBStack_3b0;
  BaseRAPass *pBStack_3a8;
  BaseRAPass *pBStack_3a0;
  BaseRAPass *pBStack_398;
  BaseRAPass *pBStack_390;
  BaseRAPass *pBStack_388;
  BaseRAPass *pBStack_378;
  BaseRAPass *pBStack_370;
  BaseRAPass *pBStack_368;
  BaseRAPass *pBStack_360;
  BaseRAPass *pBStack_358;
  BaseRAPass *pBStack_350;
  ulong local_340;
  BaseRAPass *local_338;
  BaseRAPass *local_330;
  uint *local_328;
  BaseRAPass *local_320;
  undefined1 local_318 [40];
  BaseNode **local_2f0;
  BaseRAPass *local_2e8;
  BaseRAPass *local_2e0;
  BaseRAPass *local_2d8;
  ulong local_2d0;
  BaseRAPass *local_2c8;
  long local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  ZoneVectorBase local_288;
  undefined8 local_278;
  uint uStack_270;
  uint uStack_26c;
  ulong local_268;
  BaseNode *local_260;
  undefined1 local_258;
  undefined1 auStack_257 [551];
  
  if ((this->_diagnosticOptions >> 9 & 1) == 0) {
    this_00 = (char *)0x0;
  }
  else {
    this_00 = (char *)this->_logger;
  }
  auStack_257._23_8_ = auStack_257 + 0x1f;
  auStack_257._0_15_ = SUB1615((undefined1  [16])0x0,1);
  local_258 = (String)0x20;
  auStack_257._15_8_ = (char *)0x207;
  auStack_257[0x1f] = 0;
  if ((BaseRAPass *)this_00 == (BaseRAPass *)0x0) {
    uVar12 = *(uint *)&this->field_0x148;
    if (uVar12 == 0) goto LAB_00126126;
  }
  else {
    EVar11 = 0;
    pBStack_350 = (BaseRAPass *)0x125193;
    fVar43 = Logger::logf((Logger *)this_00,0.0);
    uVar12 = *(uint *)&this->field_0x148;
    if (uVar12 == 0) {
      pBStack_350 = (BaseRAPass *)0x1251b0;
      Logger::logf((Logger *)this_00,fVar43);
      goto LAB_00125258;
    }
  }
  pBVar39 = (BaseRAPass *)(ulong)uVar12;
  local_328 = (uint *)&this->field_0x148;
  uVar13 = *(uint *)&this->field_0xb8;
  pBVar42 = (BaseRAPass *)(ulong)uVar13;
  pBVar30 = (BaseRAPass *)(ulong)*(uint *)&this->field_0xd8;
  local_288._data = (void *)0x0;
  local_288._size = 0;
  local_288._capacity = 0;
  local_2a8._0_8_ = (void *)0x0;
  local_2a8._8_4_ = 0;
  local_2a8._12_4_ = 0;
  local_2b8 = (undefined1  [16])0x0;
  pBVar32 = (BaseRAPass *)&this->_allocator;
  pBStack_350 = (BaseRAPass *)0x125215;
  EVar11 = ZoneVectorBase::_resize(&local_288,(ZoneAllocator *)pBVar32,4,uVar12);
  if (EVar11 == 0) {
    pBStack_350 = (BaseRAPass *)0x125236;
    local_318._32_8_ = pBVar30;
    EVar11 = ZoneVectorBase::_resize((ZoneVectorBase *)local_2a8,(ZoneAllocator *)pBVar32,4,uVar12);
    if (EVar11 == 0) {
      this_01 = (BaseRAPass *)local_2b8;
      pBStack_350 = (BaseRAPass *)0x125252;
      EVar11 = ZoneVectorBase::_resize((ZoneVectorBase *)this_01,(ZoneAllocator *)pBVar32,4,uVar13);
      if (EVar11 == 0) {
        local_338 = pBVar32;
        local_330 = this;
        local_2e0 = (BaseRAPass *)this_00;
        local_2d8 = pBVar39;
        local_2c8 = pBVar42;
        if (local_318._32_4_ != 0) {
          uVar12 = 0;
LAB_001252a2:
          pBVar16 = pBVar30;
          if (uVar12 < *(uint *)&this->field_0xd8) {
            this_00 = *(char **)(*(long *)&(this->_pov).field_0x0 + (ulong)uVar12 * 8);
            newSize = (uint32_t)pBVar39;
            pBStack_350 = (BaseRAPass *)0x1252dd;
            local_268 = (ulong)uVar12;
            EVar11 = ZoneBitVector::_resize
                               ((ZoneBitVector *)&((BaseRAPass *)this_00)->_iEmitHelper,
                                (ZoneAllocator *)
                                ((((BaseRAPass *)this_00)->super_FuncPass).super_Pass._vptr_Pass + 3
                                ),newSize,newSize,false);
            if (EVar11 == 0) {
              pBStack_350 = (BaseRAPass *)0x125301;
              EVar11 = ZoneBitVector::_resize
                                 ((ZoneBitVector *)&((BaseRAPass *)this_00)->_formatOptions,
                                  (ZoneAllocator *)
                                  ((((BaseRAPass *)this_00)->super_FuncPass).super_Pass._vptr_Pass +
                                  3),newSize,newSize,false);
              if (EVar11 == 0) {
                local_2e8 = (BaseRAPass *)&((BaseRAPass *)this_00)->_func;
                pBStack_350 = (BaseRAPass *)0x12532a;
                EVar11 = ZoneBitVector::_resize
                                   ((ZoneBitVector *)local_2e8,
                                    (ZoneAllocator *)
                                    ((((BaseRAPass *)this_00)->super_FuncPass).super_Pass._vptr_Pass
                                    + 3),newSize,newSize,false);
                if (EVar11 == 0) {
                  this_01 = (BaseRAPass *)&((BaseRAPass *)this_00)->_extraBlock;
                  pBStack_350 = (BaseRAPass *)0x125353;
                  local_2f0 = (BaseNode **)this_01;
                  EVar11 = ZoneBitVector::_resize
                                     ((ZoneBitVector *)this_01,
                                      (ZoneAllocator *)
                                      ((((BaseRAPass *)this_00)->super_FuncPass).super_Pass.
                                       _vptr_Pass + 3),newSize,newSize,false);
                  if (EVar11 == 0) {
                    pBVar15 = *(BaseNode **)
                               ((Array<unsigned_short,_2UL> *)
                               &(((BaseRAPass *)this_00)->super_FuncPass).super_Pass._name)->_data;
                    pBVar21 = *(BaseNode **)&(((BaseRAPass *)this_00)->_allocator).field_0x0;
                    iVar26 = 0;
                    pBVar16 = (BaseRAPass *)this_00;
                    puVar28 = local_328;
                    ppBVar36 = local_2f0;
                    local_320 = (BaseRAPass *)this_00;
                    local_260 = pBVar15;
                    do {
                      if (((byte)pBVar21[0x11] & 0x20) != 0) {
                        local_2d0 = CONCAT44(local_2d0._4_4_,iVar26);
                        lVar35 = *(long *)(pBVar21 + 0x20);
                        local_278 = pBVar21;
                        if (lVar35 == 0) goto LAB_001260f9;
                        local_340 = (ulong)*(uint *)(lVar35 + 0x10);
                        if (local_340 != 0) {
                          local_340 = local_340 << 5;
                          pBVar42 = (BaseRAPass *)0x0;
                          local_2c0 = lVar35;
                          do {
                            uVar12 = *(uint *)((long)pBVar42 + lVar35 + 0x4c);
                            this_00 = (char *)(ulong)uVar12;
                            if (local_288._size <= uVar12) {
                              pBStack_350 = (BaseRAPass *)0x1259e6;
                              buildLiveness();
LAB_001259e6:
                              pBStack_350 = (BaseRAPass *)0x1259eb;
                              buildLiveness();
LAB_001259eb:
                              pBStack_350 = (BaseRAPass *)0x1259f0;
                              buildLiveness();
LAB_001259f0:
                              pBStack_350 = (BaseRAPass *)0x1259f5;
                              buildLiveness();
LAB_001259f5:
                              pBStack_350 = (BaseRAPass *)0x1259fa;
                              buildLiveness();
                              goto LAB_001259fa;
                            }
                            *(int *)((long)local_288._data + (long)this_00 * 4) =
                                 *(int *)((long)local_288._data + (long)this_00 * 4) + 1;
                            if ((uint)local_2a8._8_4_ <= uVar12) goto LAB_001259e6;
                            uVar13 = *(uint *)((long)pBVar42 + 0x54 + lVar35);
                            piVar2 = (int *)(local_2a8._0_8_ + (long)this_00 * 4);
                            *piVar2 = *piVar2 + (uint)((uVar13 >> 1 & 1) != 0);
                            if (*(uint *)&(pBVar16->_blocks).field_0x0 <= uVar12) goto LAB_001259eb;
                            pBVar15 = *ppBVar36;
                            pBVar30 = (BaseRAPass *)(1L << ((byte)uVar12 & 0x3f));
                            pBVar32 = (BaseRAPass *)(ulong)(uVar12 >> 6);
                            p_Var20 = *(_func_int **)(pBVar15 + (long)pBVar32 * 8);
                            uVar31 = 0x40000;
                            if (((ulong)p_Var20 >> ((ulong)this_00 & 0x3f) & 1) == 0) {
                              if (uVar12 < *(uint *)&pBVar16->_stop) {
                                if (((ulong)(local_2e8->super_FuncPass).super_Pass._vptr_Pass
                                            [(long)pBVar32] & (ulong)pBVar30) == 0) {
                                  uVar31 = 0x20000;
                                  goto LAB_00125434;
                                }
                                goto LAB_0012545c;
                              }
LAB_001260e5:
                              pBStack_350 = (BaseRAPass *)0x1260ea;
                              buildLiveness();
                              goto LAB_001260ea;
                            }
LAB_00125434:
                            uVar13 = uVar13 | uVar31;
                            *(uint *)((long)pBVar42 + 0x54 + lVar35) = uVar13;
LAB_0012545c:
                            pBVar15 = pBVar15 + (long)pBVar32 * 8;
                            if ((uVar13 & 3) != 2) {
                              *(_func_int **)pBVar15 =
                                   (_func_int *)((ulong)p_Var20 & ~(ulong)pBVar30);
                              if (uVar12 < *(uint *)&pBVar16->_stop) {
                                pBVar15 = (BaseNode *)
                                          ((local_2e8->super_FuncPass).super_Pass._vptr_Pass +
                                          (long)pBVar32);
                                p_Var20 = *(_func_int **)pBVar15;
                                goto LAB_00125492;
                              }
                              pBStack_350 = (BaseRAPass *)0x1260e0;
                              buildLiveness();
LAB_001260e0:
                              pBStack_350 = (BaseRAPass *)0x1260e5;
                              buildLiveness();
                              goto LAB_001260e5;
                            }
LAB_00125492:
                            *(_func_int **)pBVar15 = (_func_int *)((ulong)p_Var20 | (ulong)pBVar30);
                            if ((uVar13 >> 0xc & 1) != 0) {
                              if (*puVar28 <= uVar12) goto LAB_001260e0;
                              puVar1 = (uint *)(*(long *)(*(long *)&(this->_workRegs).field_0x0 +
                                                         (long)this_00 * 8) + 0x24);
                              *puVar1 = *puVar1 | 0x10;
                            }
                            uVar13 = *(uint *)((long)pBVar42 + 0x50 + lVar35);
                            if ((ulong)uVar13 != 0xffffffff) {
                              if (*puVar28 <= uVar13) goto LAB_001259f0;
                              this = *(BaseRAPass **)
                                      (*(long *)&(this->_workRegs).field_0x0 + (ulong)uVar13 * 8);
                              this_01 = (BaseRAPass *)&(this->_formatOptions)._padding;
                              uVar13 = *(uint *)&this->_func;
                              if (uVar13 <= uVar12) {
                                pBStack_350 = (BaseRAPass *)0x125500;
                                EVar11 = ZoneBitVector::_resize
                                                   ((ZoneBitVector *)this_01,
                                                    (ZoneAllocator *)local_338,uVar12 + 1,uVar12 + 1
                                                    ,false);
                                if (EVar11 != 0) goto LAB_00125258;
                                uVar13 = *(uint *)&this->_func;
                                lVar35 = local_2c0;
                                pBVar16 = local_320;
                                puVar28 = local_328;
                                ppBVar36 = local_2f0;
                                pBVar39 = this_01;
                              }
                              if (uVar12 < uVar13) {
                                puVar3 = (ulong *)(*(long *)((Array<unsigned_short,_2UL> *)this_01)
                                                            ->_data + (long)pBVar32 * 8);
                                *puVar3 = *puVar3 | (ulong)pBVar30;
                                this = local_330;
                                goto LAB_0012553d;
                              }
                              goto LAB_001259f5;
                            }
LAB_0012553d:
                            pBVar42 = (BaseRAPass *)((long)pBVar42 + 0x20);
                          } while ((BaseRAPass *)local_340 != pBVar42);
                        }
                        iVar26 = (int)local_2d0 + 1;
                        pBVar15 = local_260;
                        pBVar21 = local_278;
                        pBVar39 = local_2d8;
                        pBVar32 = local_338;
                      }
                      if (pBVar21 == pBVar15) goto LAB_0012558e;
                      pBVar21 = *(BaseNode **)pBVar21;
                      if (pBVar21 == (BaseNode *)0x0) {
LAB_001260ea:
                        pBStack_350 = (BaseRAPass *)0x1260ef;
                        buildLiveness();
                        goto LAB_001260ef;
                      }
                    } while( true );
                  }
                }
              }
            }
            goto LAB_00125258;
          }
          goto LAB_00126169;
        }
LAB_001255be:
        local_318._0_16_ = (undefined1  [16])0x0;
        local_318._16_8_ = (char *)0x0;
        local_298 = (undefined1  [16])0x0;
        pBStack_350 = (BaseRAPass *)0x1255e9;
        EVar11 = ZoneStackBase::_init((ZoneStackBase *)local_318,(ZoneAllocator *)pBVar32,0x110);
        if (EVar11 == 0) {
          this_01 = (BaseRAPass *)local_298;
          pBStack_350 = (BaseRAPass *)0x12560c;
          EVar11 = ZoneBitVector::_resize
                             ((ZoneBitVector *)this_01,(ZoneAllocator *)pBVar32,
                              *(uint32_t *)&this->field_0xb8,*(uint32_t *)&this->field_0xb8,true);
          pBVar42 = (BaseRAPass *)local_318._32_8_;
          if (EVar11 == 0) {
            local_340 = CONCAT44(local_340._4_4_,(int)pBVar39 + 0x3fU >> 6);
            if ((int)local_318._32_8_ != 0) {
              pBVar32 = (BaseRAPass *)0x0;
              this_00 = local_318;
              do {
                pBVar16 = pBVar30;
                if ((BaseRAPass *)(ulong)*(uint *)&this->field_0xd8 <= pBVar32) goto LAB_0012616e;
                pBVar30 = *(BaseRAPass **)(*(long *)&this->_pov + (long)pBVar32 * 8);
                pBStack_350 = (BaseRAPass *)0x125673;
                this_01 = pBVar30;
                LiveOps::recalcInOut((RABlock *)pBVar30,(uint32_t)local_340,true);
                pBVar16 = pBVar30;
                if ((_func_int **)local_318._0_8_ == (_func_int **)0x0) goto LAB_00126173;
                pcVar22 = *(char **)(local_318._16_8_ + 0x18);
                if ((char *)(local_318._16_8_ + 0x1f8) < pcVar22) {
                  pBStack_350 = (BaseRAPass *)0x1256a6;
                  this_01 = (BaseRAPass *)this_00;
                  EVar11 = ZoneStackBase::_prepareBlock((ZoneStackBase *)this_00,1,0x20);
                  if (EVar11 != 0) goto LAB_00125610;
                  pcVar22 = *(char **)(local_318._16_8_ + 0x18);
                }
                if ((pcVar22 < (char *)(local_318._16_8_ + 0x20)) ||
                   ((char *)(local_318._16_8_ + 0x1f8) < pcVar22)) goto LAB_00126146;
                *(BaseRAPass **)pcVar22 = pBVar30;
                *(char **)(local_318._16_8_ + 0x18) = pcVar22 + 8;
                pBVar32 = (BaseRAPass *)((long)&(pBVar32->super_FuncPass).super_Pass._vptr_Pass + 1)
                ;
              } while (pBVar42 != pBVar32);
            }
LAB_001257fc:
            pBVar16 = pBVar30;
            if ((_func_int **)local_318._0_8_ != (_func_int **)0x0) {
              if (*(long *)&((BaseEmitter *)local_318._8_8_)->_diagnosticOptions !=
                  *(long *)(local_318._16_8_ + 0x18)) {
                pBStack_350 = (BaseRAPass *)0x1256fa;
                pBVar16 = (BaseRAPass *)
                          ZoneStack<asmjit::v1_14::RABlock_*>::popFirst
                                    ((ZoneStack<asmjit::v1_14::RABlock_*> *)local_318);
                pBStack_350 = (BaseRAPass *)0x12570f;
                ZoneBitVector::setBit
                          ((ZoneBitVector *)local_298,
                           ((FormatOptions *)&(pBVar16->super_FuncPass).super_Pass._cb)->_flags,
                           false);
                pBStack_350 = (BaseRAPass *)0x12571d;
                this_01 = pBVar16;
                bVar9 = LiveOps::recalcInOut((RABlock *)pBVar16,(uint32_t)local_340,false);
                if ((!bVar9) ||
                   (pBVar32 = (BaseRAPass *)(ulong)*(uint *)&pBVar16->field_0x60,
                   pBVar32 == (BaseRAPass *)0x0)) goto LAB_001257f9;
                pBVar39 = (BaseRAPass *)0x0;
LAB_00125735:
                if (pBVar39 < (BaseRAPass *)(ulong)*(uint *)&pBVar16->field_0x60) {
                  this_00 = *(char **)(*(long *)&pBVar16->field_0x58 + (long)pBVar39 * 8);
                  FVar5 = ((FormatOptions *)
                          &(((BaseRAPass *)this_00)->super_FuncPass).super_Pass._cb)->_flags;
                  if ((uint)local_298._8_4_ <= FVar5) goto LAB_001260f4;
                  uVar38 = *(ulong *)(&((FormatOptions *)(local_298._0_8_ + 8))->_indentation +
                                     (ulong)(FVar5 >> 6) * 2 + -3);
                  this_01 = (BaseRAPass *)(1L << ((byte)FVar5 & 0x3f));
                  if ((uVar38 >> ((ulong)FVar5 & 0x3f) & 1) != 0) goto LAB_001257ed;
                  *(ulong *)(&((FormatOptions *)(local_298._0_8_ + 8))->_indentation +
                            (ulong)(FVar5 >> 6) * 2 + -3) = uVar38 | (ulong)this_01;
                  if ((_func_int **)local_318._0_8_ == (_func_int **)0x0) goto LAB_0012614b;
                  pcVar22 = *(char **)(local_318._16_8_ + 0x18);
                  if ((char *)(local_318._16_8_ + 0x1f8) < pcVar22) {
                    this_01 = (BaseRAPass *)local_318;
                    pBStack_350 = (BaseRAPass *)0x1257b4;
                    EVar11 = ZoneStackBase::_prepareBlock((ZoneStackBase *)this_01,1,0x20);
                    if (EVar11 != 0) goto LAB_00125610;
                    pcVar22 = *(char **)(local_318._16_8_ + 0x18);
                  }
                  if (((char *)(local_318._16_8_ + 0x20) <= pcVar22) &&
                     (pcVar22 <= (char *)(local_318._16_8_ + 0x1f8))) {
                    *(char **)pcVar22 = this_00;
                    *(char **)(local_318._16_8_ + 0x18) = pcVar22 + 8;
                    goto LAB_001257ed;
                  }
                  pBStack_350 = (BaseRAPass *)0x126132;
                  buildLiveness();
LAB_00126132:
                  pBStack_350 = (BaseRAPass *)0x126137;
                  buildLiveness();
LAB_00126137:
                  pBStack_350 = (BaseRAPass *)0x12613c;
                  buildLiveness();
LAB_0012613c:
                  pBStack_350 = (BaseRAPass *)0x126141;
                  buildLiveness();
LAB_00126141:
                  pBStack_350 = (BaseRAPass *)0x126146;
                  buildLiveness();
                  goto LAB_00126146;
                }
LAB_001260ef:
                pBStack_350 = (BaseRAPass *)0x1260f4;
                buildLiveness();
LAB_001260f4:
                pBStack_350 = (BaseRAPass *)0x1260f9;
                buildLiveness();
LAB_001260f9:
                pBStack_350 = (BaseRAPass *)0x1260fe;
                buildLiveness();
                goto LAB_001260fe;
              }
              this_00 = local_318;
              pBStack_350 = (BaseRAPass *)0x125831;
              ZoneStackBase::_init((ZoneStackBase *)this_00,(ZoneAllocator *)0x0,0);
              pBStack_350 = (BaseRAPass *)0x125843;
              ZoneBitVector::release((ZoneBitVector *)local_298,(ZoneAllocator *)local_338);
              pBStack_350 = (BaseRAPass *)0x12584f;
              this_01 = (BaseRAPass *)this_00;
              ZoneStackBase::_init((ZoneStackBase *)this_00,(ZoneAllocator *)0x0,0);
              if (local_2e0 == (BaseRAPass *)0x0) goto LAB_00125917;
              pBStack_350 = (BaseRAPass *)0x125871;
              this_01 = local_2e0;
              Logger::logf((Logger *)local_2e0,__x);
              if (local_2c8 == (BaseRAPass *)0x0) goto LAB_00125917;
              pBVar32 = (BaseRAPass *)auStack_257;
              this_00 = "  {#%u}\n";
              pBVar42 = (BaseRAPass *)&local_258;
              pBVar30 = (BaseRAPass *)0x0;
              goto LAB_00125899;
            }
            goto LAB_00126150;
          }
        }
LAB_00125610:
        pBStack_350 = (BaseRAPass *)0x125620;
        ZoneStackBase::_init((ZoneStackBase *)local_318,(ZoneAllocator *)0x0,0);
      }
    }
  }
  goto LAB_00125258;
LAB_0012558e:
  FVar5 = ((FormatOptions *)&(pBVar16->super_FuncPass).super_Pass._cb)->_flags;
  if ((uint)local_2b8._8_4_ <= FVar5) goto LAB_0012619b;
  *(int *)(local_2b8._0_8_ + (ulong)FVar5 * 4) = iVar26;
  uVar12 = (int)local_268 + 1;
  if (uVar12 == local_318._32_4_) goto LAB_001255be;
  goto LAB_001252a2;
LAB_001257ed:
  pBVar39 = (BaseRAPass *)((long)&(pBVar39->super_FuncPass).super_Pass._vptr_Pass + 1);
  if (pBVar32 == pBVar39) goto LAB_001257f9;
  goto LAB_00125735;
LAB_001257f9:
  pBVar42 = (BaseRAPass *)(ulong)((int)pBVar42 + 1);
  pBVar30 = pBVar16;
  goto LAB_001257fc;
LAB_00125f8a:
  *(uint *)((long)ppBVar36 + 0x34) = uVar12;
  *(uint *)(ppBVar36 + 7) = uVar13;
  *(uint *)((long)ppBVar36 + 0x3c) = uVar31;
  *(uint *)(ppBVar36 + 8) = uVar49;
  uVar34 = (local_330->_globalMaxLiveCount).n._data[0];
  uVar14 = (local_330->_globalMaxLiveCount).n._data[1];
  uVar41 = (local_330->_globalMaxLiveCount).n._data[2];
  uVar44 = (local_330->_globalMaxLiveCount).n._data[3];
  uVar45 = -(uint)((int)(uVar12 ^ 0x80000000) < (int)(uVar34 ^ 0x80000000));
  uVar46 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)(uVar14 ^ 0x80000000));
  uVar47 = -(uint)((int)(uVar31 ^ 0x80000000) < (int)(uVar41 ^ 0x80000000));
  uVar48 = -(uint)((int)(uVar49 ^ 0x80000000) < (int)(uVar44 ^ 0x80000000));
  (local_330->_globalMaxLiveCount).n._data[0] = ~uVar45 & uVar12 | uVar34 & uVar45;
  (local_330->_globalMaxLiveCount).n._data[1] = ~uVar46 & uVar13 | uVar14 & uVar46;
  (local_330->_globalMaxLiveCount).n._data[2] = ~uVar47 & uVar31 | uVar41 & uVar47;
  (local_330->_globalMaxLiveCount).n._data[3] = ~uVar48 & uVar49 | uVar44 & uVar48;
  if ((int)uVar38 != *(int *)((long)ppBVar36 + 0x24)) goto LAB_001261b9;
LAB_00125fcf:
  local_320 = (BaseRAPass *)((long)&(local_320->super_FuncPass).super_Pass._vptr_Pass + 1);
  if (local_320 == local_2c8) goto LAB_00125fea;
  goto LAB_00125a4b;
LAB_00126146:
  pBStack_350 = (BaseRAPass *)0x12614b;
  buildLiveness();
LAB_0012614b:
  pBStack_350 = (BaseRAPass *)0x126150;
  buildLiveness();
LAB_00126150:
  pBStack_350 = (BaseRAPass *)0x126155;
  buildLiveness();
LAB_00126155:
  pBStack_350 = (BaseRAPass *)0x12615a;
  buildLiveness();
LAB_0012615a:
  pBStack_350 = (BaseRAPass *)0x12615f;
  buildLiveness();
LAB_0012615f:
  pBStack_350 = (BaseRAPass *)0x126164;
  buildLiveness();
LAB_00126164:
  pBStack_350 = (BaseRAPass *)0x126169;
  buildLiveness();
LAB_00126169:
  pBStack_350 = (BaseRAPass *)0x12616e;
  buildLiveness();
LAB_0012616e:
  pBStack_350 = (BaseRAPass *)0x126173;
  buildLiveness();
LAB_00126173:
  pBStack_350 = (BaseRAPass *)0x126178;
  buildLiveness();
LAB_00126178:
  pBStack_350 = (BaseRAPass *)0x12617d;
  buildLiveness();
LAB_0012617d:
  pBStack_350 = (BaseRAPass *)0x126182;
  buildLiveness();
LAB_00126182:
  pBStack_350 = (BaseRAPass *)0x126187;
  buildLiveness();
  pBVar30 = pBVar16;
LAB_00126187:
  pBStack_350 = (BaseRAPass *)0x12618c;
  buildLiveness();
LAB_0012618c:
  pBStack_350 = (BaseRAPass *)0x126191;
  buildLiveness();
LAB_00126191:
  pBStack_350 = (BaseRAPass *)0x126196;
  buildLiveness();
LAB_00126196:
  pBStack_350 = (BaseRAPass *)0x12619b;
  buildLiveness();
LAB_0012619b:
  pBStack_350 = (BaseRAPass *)0x1261a0;
  buildLiveness();
LAB_001261a0:
  pBStack_350 = (BaseRAPass *)0x1261a5;
  buildLiveness();
LAB_001261a5:
  pBStack_350 = (BaseRAPass *)0x1261aa;
  buildLiveness();
LAB_001261aa:
  pBStack_350 = (BaseRAPass *)0x1261af;
  buildLiveness();
LAB_001261af:
  pBStack_350 = (BaseRAPass *)0x1261b4;
  buildLiveness();
LAB_001261b4:
  pBStack_350 = (BaseRAPass *)0x1261b9;
  buildLiveness();
LAB_001261b9:
  pBStack_350 = (BaseRAPass *)assignArgIndexToWorkRegs;
  buildLiveness();
  pBVar29 = (BaseRAPass *)this_00;
  pBVar16 = this;
  pBStack_378 = (BaseRAPass *)this_00;
  pBStack_370 = pBVar39;
  pBStack_368 = pBVar42;
  pBStack_360 = pBVar32;
  pBStack_358 = this;
  pBStack_350 = pBVar30;
  if (*(int *)&this_01->field_0xb8 == 0) {
LAB_0012630e:
    pBStack_388 = (BaseRAPass *)0x126313;
    assignArgIndexToWorkRegs();
    auStack_7d8._24_8_ = auStack_7b8;
    auStack_7d8._8_8_ = (BaseBuilder *)0x0;
    auStack_7d8._0_8_ = (_func_int **)0x20;
    auStack_7d8._16_8_ = (char *)0x407;
    auStack_7b8[0] = 0;
    plVar24 = *(long **)&(this_01->_blocks).field_0x0;
    plVar4 = plVar24 + *(uint *)&this_01->field_0xb8;
    pBStack_3b0 = pBVar29;
    pBStack_3a8 = pBVar39;
    pBStack_3a0 = pBVar42;
    pBStack_398 = pBVar32;
    pBStack_390 = pBVar16;
    pBStack_388 = pBVar30;
    do {
      if (plVar24 == plVar4) {
        String::reset((String *)auStack_7d8);
        return 0;
      }
      pBVar15 = *(BaseNode **)(*plVar24 + 0x10);
      if (pBVar15 != (BaseNode *)0x0) {
        pBVar21 = *(BaseNode **)(*plVar24 + 0x18);
        while( true ) {
          String::clear((String *)auStack_7d8);
          Formatter::formatNode
                    ((String *)auStack_7d8,&this_01->_formatOptions,
                     *(BaseBuilder **)&(this_01->super_FuncPass).super_Pass._cb,pBVar15);
          if (((((this_01->_diagnosticOptions & kRADebugLiveness) != kNone) &&
               (((byte)pBVar15[0x11] & 0x20) != 0)) &&
              (lVar35 = *(long *)(pBVar15 + 0x20), lVar35 != 0)) && (*(int *)(lVar35 + 0x10) != 0))
          {
            String::padEnd((String *)auStack_7d8,0x28,' ');
            pBVar32 = (BaseRAPass *)auStack_7d8;
            String::_opString((String *)auStack_7d8,kAppend," | ",0xffffffffffffffff);
            uVar12 = *(uint *)(lVar35 + 0x10);
            if ((ulong)uVar12 != 0) {
              lVar40 = 0;
              do {
                if (lVar40 != 0) {
                  pBVar32 = (BaseRAPass *)auStack_7d8;
                  String::_opChar((String *)auStack_7d8,kAppend,' ');
                }
                uVar13 = *(uint *)(lVar35 + 0x4c + lVar40);
                if (*(uint *)&this_01->field_0x148 <= uVar13) {
                  annotateCode();
                  EVar11 = initGlobalLiveSpans(pBVar32);
                  if (EVar11 != 0) {
                    return EVar11;
                  }
                  group = k0;
                  do {
                    EVar11 = binPack(pBVar32,group);
                    if (EVar11 != 0) {
                      return EVar11;
                    }
                    group = group + kVec;
                  } while (group != kPC);
                  return 0;
                }
                lVar25 = *(long *)(*(long *)(*(long *)&(this_01->_workRegs).field_0x0 +
                                            (ulong)uVar13 * 8) + 8);
                if (*(uint *)(lVar25 + 0x18) < 0xc) {
                  lVar25 = lVar25 + 0x1c;
                }
                else {
                  lVar25 = *(long *)(lVar25 + 0x20);
                }
                String::_opFormat((String *)auStack_7d8,kAppend,"%s{",lVar25);
                uVar13 = *(uint *)(lVar35 + 0x54 + lVar40);
                c = 'X';
                if ((((~uVar13 & 3) != 0) && (c = 'R', (uVar13 & 1) == 0)) &&
                   (c = 'W', (uVar13 & 2) == 0)) {
                  c = '?';
                }
                String::_opChar((String *)auStack_7d8,kAppend,c);
                uVar13 = *(uint *)(lVar35 + 0x54 + lVar40);
                if ((uVar13 >> 0xc & 1) != 0) {
                  String::_opFormat((String *)auStack_7d8,kAppend,"|Lead[%u]",
                                    (ulong)((uVar13 >> 0xd & 3) + 1));
                }
                if (*(char *)(lVar35 + 0x5a + lVar40) == -1) {
                  if ((*(byte *)(lVar35 + 0x54 + lVar40) & 4) != 0) {
                    String::_opString((String *)auStack_7d8,kAppend,"|Use",0xffffffffffffffff);
                  }
                }
                else {
                  String::_opFormat((String *)auStack_7d8,kAppend,"|Use=%u");
                }
                uVar13 = *(uint *)(lVar35 + 0x54 + lVar40);
                if ((uVar13 & 0x1400) == 0x400) {
                  String::_opFormat((String *)auStack_7d8,kAppend,"+%u",(ulong)(uVar13 >> 0xd & 3));
                }
                if (*(char *)(lVar35 + 0x5b + lVar40) == -1) {
                  if ((*(byte *)(lVar35 + 0x54 + lVar40) & 8) != 0) {
                    String::_opString((String *)auStack_7d8,kAppend,"|Out",0xffffffffffffffff);
                  }
                }
                else {
                  String::_opFormat((String *)auStack_7d8,kAppend,"|Out=%u");
                }
                uVar13 = *(uint *)(lVar35 + 0x54 + lVar40);
                if ((uVar13 & 0x1800) == 0x800) {
                  String::_opFormat((String *)auStack_7d8,kAppend,"+%u",(ulong)(uVar13 >> 0xd & 3));
                  uVar13 = *(uint *)(lVar35 + 0x54 + lVar40);
                }
                if ((uVar13 >> 0x11 & 1) != 0) {
                  String::_opString((String *)auStack_7d8,kAppend,"|Last",0xffffffffffffffff);
                  uVar13 = *(uint *)(lVar35 + 0x54 + lVar40);
                }
                if ((uVar13 >> 0x12 & 1) != 0) {
                  String::_opString((String *)auStack_7d8,kAppend,"|Kill",0xffffffffffffffff);
                }
                pBVar32 = (BaseRAPass *)auStack_7d8;
                String::_opString((String *)auStack_7d8,kAppend,"}",0xffffffffffffffff);
                lVar40 = lVar40 + 0x20;
              } while ((ulong)uVar12 << 5 != lVar40);
            }
          }
          iVar26 = (int)auStack_7d8 + 1;
          if (0x1e < (byte)auStack_7d8[0]) {
            iVar26 = (int)auStack_7d8._24_8_;
          }
          iVar26 = Zone::dup((Zone *)(*(long *)&(this_01->super_FuncPass).super_Pass._cb + 0xb8),
                             iVar26);
          *(ulong *)(pBVar15 + 0x28) = CONCAT44(extraout_var,iVar26);
          if (pBVar15 == pBVar21) break;
          pBVar15 = *(BaseNode **)(pBVar15 + 8);
        }
      }
      plVar24 = plVar24 + 1;
    } while( true );
  }
  pFVar6 = this_01->_func;
  uVar38 = (ulong)(byte)pFVar6->field_0xa8;
  if (uVar38 != 0) {
    lVar35 = **(long **)&(this_01->_blocks).field_0x0;
    puVar18 = &pFVar6->field_0xd0;
    puVar33 = &pFVar6->_args->_data[0]._id;
    uVar37 = 0;
    do {
      if (uVar37 == uVar38) {
LAB_00126309:
        pBStack_388 = (BaseRAPass *)0x12630e;
        assignArgIndexToWorkRegs();
        goto LAB_0012630e;
      }
      lVar40 = *(long *)&(this_01->super_FuncPass).super_Pass._cb;
      pAVar7 = this_01->_archTraits;
      pBVar29 = (BaseRAPass *)0x0;
      do {
        if (puVar33[(long)pBVar29 * 2 + -1] != 0) {
          uVar12 = puVar33[(long)pBVar29 * 2] - 0x100;
          pBVar30 = (BaseRAPass *)(ulong)uVar12;
          if (uVar12 < *(uint *)(lVar40 + 0x1f0)) {
            pBVar16 = *(BaseRAPass **)(lVar40 + 0x1e8);
            pBVar32 = (BaseRAPass *)(&(pBVar16->super_FuncPass).super_Pass._vptr_Pass)[uVar12];
            if ((pBVar32 != (BaseRAPass *)0x0) &&
               (pBVar32 = *(BaseRAPass **)&pBVar32->field_0x28, pBVar32 != (BaseRAPass *)0x0)) {
              uVar12 = *(uint *)&(pBVar32->super_FuncPass).super_Pass._vptr_Pass;
              pBVar16 = (BaseRAPass *)(ulong)uVar12;
              if (*(uint *)(lVar35 + 0x80) <= uVar12) {
                pBStack_388 = (BaseRAPass *)0x1262ff;
                assignArgIndexToWorkRegs();
LAB_001262ff:
                pBStack_388 = (BaseRAPass *)0x126304;
                assignArgIndexToWorkRegs();
LAB_00126304:
                pBStack_388 = (BaseRAPass *)0x126309;
                assignArgIndexToWorkRegs();
                goto LAB_00126309;
              }
              pBVar42 = (BaseRAPass *)(ulong)(uVar12 >> 6);
              pBVar39 = *(BaseRAPass **)(*(long *)(lVar35 + 0x78) + (long)pBVar42 * 8);
              if (((ulong)pBVar39 >> ((ulong)pBVar16 & 0x3f) & 1) != 0) {
                pBVar32->field_0x48 = (char)uVar37;
                pBVar32->field_0x49 = (char)pBVar29;
                if (0x1f < uVar37) goto LAB_001262ff;
                uVar12 = *(uint *)(puVar18 + (long)pBVar29 * 4);
                pBVar16 = (BaseRAPass *)(ulong)uVar12;
                if ((uVar12 >> 8 & 1) != 0) {
                  if (0x1fffffff < uVar12) goto LAB_00126304;
                  pBVar39 = (BaseRAPass *)(ulong)(uVar12 >> 0x18);
                  uVar13 = *(uint *)&pBVar32->field_0x20 ^
                           (pAVar7->_regSignature)._data[(long)pBVar39]._bits;
                  pBVar30 = (BaseRAPass *)(ulong)uVar13;
                  if ((uVar13 & 0xf00) == 0) {
                    pBVar16 = (BaseRAPass *)(ulong)(uVar12 >> 0x10);
                    pBVar32->field_0x4b = (char)(uVar12 >> 0x10);
                  }
                }
              }
            }
          }
        }
        pBVar29 = (BaseRAPass *)((long)&(pBVar29->super_FuncPass).super_Pass._vptr_Pass + 1);
      } while (pBVar29 != (BaseRAPass *)0x4);
      uVar37 = uVar37 + 1;
      puVar33 = puVar33 + 8;
      puVar18 = puVar18 + 0x10;
    } while (uVar37 != uVar38);
  }
  return 0;
  while( true ) {
    pBVar39 = *(BaseRAPass **)(*(long *)&this->_blocks + (long)pBVar30 * 8);
    pBStack_350 = (BaseRAPass *)0x1258c8;
    EVar11 = String::_opFormat((String *)pBVar42,kAssign,"  {#%u}\n",
                               (ulong)((FormatOptions *)&(pBVar39->super_FuncPass).super_Pass._cb)->
                                      _flags);
    if (EVar11 != 0) goto LAB_00125258;
    pBStack_350 = (BaseRAPass *)0x1258de;
    _dumpBlockLiveness(this,(String *)pBVar42,(RABlock *)pBVar39);
    pBVar27 = (BaseBuilder *)(ulong)(byte)local_258;
    pBVar16 = pBVar32;
    if ((BaseBuilder *)0x1e < (BaseBuilder *)(ulong)(byte)local_258) {
      pBVar27 = (BaseBuilder *)auStack_257._7_8_;
      pBVar16 = (BaseRAPass *)auStack_257._23_8_;
    }
    pBStack_350 = (BaseRAPass *)0x12590a;
    this_01 = local_2e0;
    (*(local_2e0->super_FuncPass).super_Pass._vptr_Pass[2])(local_2e0,pBVar16,pBVar27);
    pBVar30 = (BaseRAPass *)((long)&(pBVar30->super_FuncPass).super_Pass._vptr_Pass + 1);
    if (local_2c8 == pBVar30) break;
LAB_00125899:
    if ((BaseRAPass *)(ulong)*(uint *)&this->field_0xb8 <= pBVar30) goto LAB_001261aa;
  }
LAB_00125917:
  this = local_338;
  local_2d8 = (BaseRAPass *)(ulong)((int)local_2d8 + (uint)((int)local_2d8 == 0));
  pBVar32 = (BaseRAPass *)0x0;
  puVar28 = local_328;
  do {
    pBVar16 = pBVar30;
    if ((BaseRAPass *)(ulong)*puVar28 <= pBVar32) goto LAB_0012617d;
    if ((BaseRAPass *)(ulong)local_288._size <= pBVar32) goto LAB_00126182;
    this_00 = *(char **)(*(long *)&(local_330->_workRegs).field_0x0 + (long)pBVar32 * 8);
    if (*(uint *)((long)&((BaseRAPass *)this_00)->_iEmitHelper + 4) <
        *(uint *)((long)local_288._data + (long)pBVar32 * 4)) {
      this_01 = (BaseRAPass *)&((BaseRAPass *)this_00)->field_0x70;
      pBStack_350 = (BaseRAPass *)0x1259b1;
      EVar11 = ZoneVectorBase::_reserve
                         ((ZoneVectorBase *)this_01,(ZoneAllocator *)this,8,
                          *(uint *)((long)local_288._data + (long)pBVar32 * 4));
      puVar28 = local_328;
      if (EVar11 != 0) goto LAB_00125258;
    }
    if ((BaseRAPass *)(ulong)(uint)local_2a8._8_4_ <= pBVar32) goto LAB_00126187;
    uVar12 = *(uint *)(local_2a8._0_8_ + (long)pBVar32 * 4);
    if (*(uint *)(((BaseRAPass *)this_00)->_formatOptions)._indentation._data < uVar12) {
      this_00 = (char *)&((BaseRAPass *)this_00)->_logger;
      pBStack_350 = (BaseRAPass *)0x1259d3;
      this_01 = (BaseRAPass *)this_00;
      EVar11 = ZoneVectorBase::_reserve((ZoneVectorBase *)this_00,(ZoneAllocator *)this,8,uVar12);
      puVar28 = local_328;
      if (EVar11 != 0) goto LAB_00125258;
    }
    pBVar32 = (BaseRAPass *)((long)&(pBVar32->super_FuncPass).super_Pass._vptr_Pass + 1);
  } while (local_2d8 != pBVar32);
LAB_001259fa:
  pBVar42 = this;
  pBStack_350 = (BaseRAPass *)0x125a0a;
  ZoneVector<unsigned_int>::release((ZoneVector<unsigned_int> *)&local_288,(ZoneAllocator *)pBVar42)
  ;
  this_01 = (BaseRAPass *)local_2a8;
  pBStack_350 = (BaseRAPass *)0x125a1d;
  ZoneVector<unsigned_int>::release((ZoneVector<unsigned_int> *)this_01,(ZoneAllocator *)pBVar42);
  this = pBVar42;
  if (local_2c8 != (BaseRAPass *)0x0) {
    uVar38 = 2;
    local_320 = (BaseRAPass *)0x0;
    puVar28 = local_328;
LAB_00125a4b:
    if (local_320 < (BaseRAPass *)(ulong)*(uint *)&local_330->field_0xb8) {
      ppBVar36 = *(BaseNode ***)(*(long *)&(local_330->_blocks).field_0x0 + (long)local_320 * 8);
      if ((*(undefined1 *)((long)ppBVar36 + 0xc) & 2) == 0) goto LAB_00125fcf;
      if (local_320 < (BaseRAPass *)(ulong)(uint)local_2b8._8_4_) {
        local_2c0 = CONCAT44(local_2c0._4_4_,*(undefined4 *)(ppBVar36 + 1));
        pBVar29 = (BaseRAPass *)ppBVar36[2];
        pBVar16 = *(BaseRAPass **)(ppBVar36 + 3);
        iVar26 = (int)uVar38 + *(int *)(local_2b8._0_8_ + (long)local_320 * 4) * 2;
        *(int *)(ppBVar36 + 4) = (int)uVar38;
        local_340 = CONCAT44(local_340._4_4_,iVar26);
        *(int *)((long)ppBVar36 + 0x24) = iVar26;
        local_318._0_16_ = ZEXT816(0);
        uVar12 = (((RARegCount *)(ppBVar36 + 0x10))->field_0)._packed + 0x3f & 0xffffffc0;
        this = (BaseRAPass *)(ulong)uVar12;
        local_2f0 = ppBVar36;
        local_318._32_8_ = pBVar16;
        if (uVar12 != 0) {
          pBVar32 = (BaseRAPass *)ppBVar36[0xf];
          pBVar17 = (BaseRAPass *)0x0;
          pBVar23 = *(BaseRAPass **)pBVar32;
          while (pBVar32 = (BaseRAPass *)((long)pBVar32 + 8), pBVar23 == (BaseRAPass *)0x0) {
            pBVar17 = (BaseRAPass *)&pBVar17->field_0x40;
            if (this <= pBVar17) goto LAB_00125c2c;
            pBVar23 = *(BaseRAPass **)pBVar32;
          }
          do {
            pBVar30 = (BaseRAPass *)((ulong)&pBVar23[-1].field_0x4af & (ulong)pBVar23);
            pBVar39 = pBVar17;
            while (pBVar30 == (BaseRAPass *)0x0) {
              pBVar39 = (BaseRAPass *)&pBVar39->field_0x40;
              if (this <= pBVar39) {
                pBVar30 = (BaseRAPass *)0x0;
                break;
              }
              pFVar8 = &pBVar32->super_FuncPass;
              pBVar32 = (BaseRAPass *)&(pBVar32->super_FuncPass).super_Pass._cb;
              pBVar30 = (BaseRAPass *)(pFVar8->super_Pass)._vptr_Pass;
            }
            lVar35 = 0;
            if (pBVar23 != (BaseRAPass *)0x0) {
              for (; ((ulong)pBVar23 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
              }
            }
            uVar37 = (ulong)(uint)((int)lVar35 + (int)pBVar17);
            if (*puVar28 <= uVar37) goto LAB_00126191;
            this_00 = *(char **)(*(long *)&(local_330->_workRegs).field_0x0 + uVar37 * 8);
            bVar10 = ((BaseRAPass *)this_00)->field_0x21 & 0xf;
            if (3 < bVar10) goto LAB_00126196;
            *(int *)(local_318 + (ulong)bVar10 * 4) = *(int *)(local_318 + (ulong)bVar10 * 4) + 1;
            this_01 = (BaseRAPass *)&((BaseRAPass *)this_00)->field_0x50;
            uVar12 = *(uint *)&((BaseRAPass *)this_00)->field_0x58;
            if (uVar12 == 0) {
LAB_00125be3:
              if (uVar12 == *(uint *)&((BaseRAPass *)this_00)->field_0x5c) {
                pBStack_350 = (BaseRAPass *)0x125b29;
                local_2e8 = pBVar29;
                local_2d0 = uVar38;
                EVar11 = ZoneVectorBase::_grow
                                   ((ZoneVectorBase *)this_01,(ZoneAllocator *)pBVar42,0xc,1);
                if (EVar11 != 0) goto LAB_00125258;
                uVar12 = *(uint *)&((BaseRAPass *)this_00)->field_0x58;
                pBVar29 = local_2e8;
                ppBVar36 = local_2f0;
                puVar28 = local_328;
                uVar38 = local_2d0;
                pBVar16 = (BaseRAPass *)local_318._32_8_;
                pBVar42 = local_338;
              }
              lVar35 = *(long *)&((BaseRAPass *)this_00)->field_0x50;
              uVar37 = (ulong)uVar12;
              *(int *)(lVar35 + uVar37 * 0xc) = (int)uVar38;
              *(uint32_t *)(lVar35 + 4 + uVar37 * 0xc) = (uint32_t)local_340;
              *(undefined4 *)(lVar35 + 8 + uVar37 * 0xc) = 0xff;
              *(int *)&((BaseRAPass *)this_00)->field_0x58 =
                   *(int *)&((BaseRAPass *)this_00)->field_0x58 + 1;
            }
            else {
              if (*(uint *)(*(long *)this_01 + 4 + (ulong)(uVar12 - 1) * 0xc) < (uint)uVar38)
              goto LAB_00125be3;
              *(uint32_t *)(*(long *)this_01 + (ulong)(uVar12 - 1) * 0xc + 4) = (uint32_t)local_340;
            }
            pBVar17 = pBVar39;
            pBVar23 = pBVar30;
          } while (pBVar30 != (BaseRAPass *)0x0);
        }
LAB_00125c2c:
        uVar12 = 0;
        uVar13 = 0;
        uVar31 = 0;
        uVar49 = 0;
        do {
          if ((((Array<unsigned_short,_2UL> *)&(pBVar29->super_FuncPass).super_Pass._name)->_data[0]
              & 0x2000) != 0) {
            pBVar16 = *(BaseRAPass **)&pBVar29->field_0x20;
            pBVar30 = pBVar16;
            if (pBVar16 == (BaseRAPass *)0x0) goto LAB_001261a5;
            uVar37 = (ulong)*(uint *)((Array<unsigned_short,_2UL> *)
                                     &(pBVar16->super_FuncPass).super_Pass._name)->_data;
            ((Array<unsigned_short,_2UL> *)&(pBVar29->super_FuncPass).super_Pass._name)[1] =
                 (Array<unsigned_short,_2UL>)(int)uVar38;
            *(undefined8 *)&pBVar16->field_0x1c = local_318._0_8_;
            *(undefined8 *)&pBVar16->field_0x24 = local_318._8_8_;
            if (uVar37 != 0) {
              this = (BaseRAPass *)(uVar37 << 5);
              pBVar39 = (BaseRAPass *)0x0;
              local_2e8 = pBVar29;
              do {
                uVar34 = *(uint *)(&pBVar16->field_0x4c + (long)pBVar39);
                if (*puVar28 <= uVar34) goto LAB_00126132;
                pBVar32 = *(BaseRAPass **)
                           (*(long *)&(local_330->_workRegs).field_0x0 + (ulong)uVar34 * 8);
                if (*(uint *)((long)&pBVar32->_iEmitHelper + 4) <= *(uint *)&pBVar32->_iEmitHelper)
                goto LAB_00126137;
                *(BaseRAPass **)
                 (*(long *)&pBVar32->field_0x70 + (ulong)*(uint *)&pBVar32->_iEmitHelper * 8) =
                     local_2e8;
                *(int *)&pBVar32->_iEmitHelper = *(int *)&pBVar32->_iEmitHelper + 1;
                if (((&pBVar16->field_0x54)[(long)pBVar39] & 2) != 0) {
                  FVar5 = (pBVar32->_formatOptions)._flags;
                  if (*(FormatFlags *)(pBVar32->_formatOptions)._indentation._data <= FVar5)
                  goto LAB_00126155;
                  *(BaseRAPass **)
                   (&(pBVar32->_logger->_options)._indentation + (ulong)FVar5 * 2 + -3) = local_2e8;
                  (pBVar32->_formatOptions)._flags = (pBVar32->_formatOptions)._flags + kMachineCode
                  ;
                }
                if (*(int *)&pBVar32->field_0x28 != (int)local_2c0) {
                  *(undefined4 *)&pBVar32->field_0x28 = 0xffffffff;
                  pBVar32->field_0x24 = pBVar32->field_0x24 | 4;
                }
                uVar14 = *(uint *)(&pBVar16->field_0x54 + (long)pBVar39);
                if ((uVar14 >> 0x11 & 1) != 0) {
                  if (*(uint *)(ppBVar36 + 0x12) <= uVar34) goto LAB_0012615a;
                  if ((*(ulong *)((long)ppBVar36[0x11] + (ulong)(uVar34 >> 6) * 8) >>
                       ((ulong)uVar34 & 0x3f) & 1) == 0) {
                    uVar14 = uVar14 | 0x40000;
                    *(uint *)(&pBVar16->field_0x54 + (long)pBVar39) = uVar14;
                  }
                }
                this_00 = &pBVar32->field_0x50;
                uVar41 = (~uVar14 & 1) + (int)uVar38;
                uVar34 = *(uint *)&pBVar32->field_0x58;
                if (uVar34 == 0) {
LAB_00125d59:
                  if (uVar34 == *(uint *)&pBVar32->field_0x5c) {
                    local_278 = (BaseNode *)CONCAT44(uVar13,uVar12);
                    pBStack_350 = (BaseRAPass *)0x125ed0;
                    this_01 = (BaseRAPass *)this_00;
                    local_2d0 = uVar38;
                    uStack_270 = uVar31;
                    uStack_26c = uVar49;
                    EVar11 = ZoneVectorBase::_grow
                                       ((ZoneVectorBase *)this_00,(ZoneAllocator *)local_338,0xc,1);
                    if (EVar11 != 0) goto LAB_00125258;
                    uVar34 = *(uint *)&pBVar32->field_0x58;
                    ppBVar36 = local_2f0;
                    puVar28 = local_328;
                    uVar38 = local_2d0;
                    uVar12 = (uint)local_278;
                    uVar13 = local_278._4_4_;
                    uVar31 = uStack_270;
                    uVar49 = uStack_26c;
                  }
                  lVar35 = *(long *)&pBVar32->field_0x50;
                  uVar37 = (ulong)uVar34;
                  *(uint *)(lVar35 + uVar37 * 0xc) = uVar41;
                  *(uint32_t *)(lVar35 + 4 + uVar37 * 0xc) = (uint32_t)local_340;
                  *(undefined4 *)(lVar35 + 8 + uVar37 * 0xc) = 0xff;
                  *(int *)&pBVar32->field_0x58 = *(int *)&pBVar32->field_0x58 + 1;
                  bVar10 = pBVar32->field_0x21 & 0xf;
LAB_00125d91:
                  pBVar42 = local_338;
                  if (3 < bVar10) goto LAB_00126141;
                  *(int *)(local_318 + (ulong)bVar10 * 4) =
                       *(int *)(local_318 + (ulong)bVar10 * 4) + 1;
                  *(int *)((long)(&pBVar16->_formatOptions + -9) + (ulong)bVar10 * 4) =
                       *(int *)((long)(&pBVar16->_formatOptions + -9) + (ulong)bVar10 * 4) + 1;
                  uVar14 = *(uint *)(&pBVar16->field_0x54 + (long)pBVar39);
                }
                else {
                  uVar37 = (ulong)(uVar34 - 1);
                  this_01 = (BaseRAPass *)(uVar37 * 3);
                  uVar44 = *(uint *)(*(long *)this_00 + 4 + uVar37 * 0xc);
                  if (uVar44 < uVar41) goto LAB_00125d59;
                  *(uint32_t *)(*(long *)this_00 + uVar37 * 0xc + 4) = (uint32_t)local_340;
                  bVar10 = pBVar32->field_0x21 & 0xf;
                  if (uVar44 <= uVar41) goto LAB_00125d91;
                }
                uVar37 = (ulong)bVar10;
                pBVar42 = local_338;
                if ((uVar14 >> 0x12 & 1) != 0) {
                  if (*(int *)&pBVar32->field_0x58 == 0) goto LAB_0012615f;
                  this_01 = *(BaseRAPass **)this_00;
                  *(uint *)((long)&(this_01->super_FuncPass).super_Pass._vptr_Pass +
                           (ulong)(*(int *)&pBVar32->field_0x58 - 1) * 0xc + 4) =
                       (int)uVar38 - (uVar14 | 0xfffffffe);
                  if (3 < bVar10) goto LAB_00126164;
                  *(int *)(local_318 + uVar37 * 4) = *(int *)(local_318 + uVar37 * 4) + -1;
                  ppBVar36 = local_2f0;
                }
                bVar19 = (&pBVar16->field_0x5a)[(long)pBVar39];
                if (bVar19 != 0xff) {
                  uVar34 = 1 << (bVar19 & 0x1f);
                  this_01 = (BaseRAPass *)(ulong)uVar34;
                  *(uint *)&pBVar32->field_0x2c = *(uint *)&pBVar32->field_0x2c | uVar34;
                  if (pBVar32->field_0x4b == -1) {
                    if (3 < bVar10) goto LAB_00126178;
                    if ((*(uint *)((long)(&pBVar16->_formatOptions + -7) + uVar37 * 4 + 8) & uVar34)
                        == 0) {
                      pBVar32->field_0x4b = bVar19;
                    }
                  }
                }
                uVar34 = *(uint *)(&pBVar16->field_0x5c + (long)pBVar39);
                if ((uVar34 != 0) &&
                   (*(uint *)&pBVar32->field_0x30 = *(uint *)&pBVar32->field_0x30 & uVar34,
                   (pBVar32->field_0x24 & 0x10) != 0)) {
                  *(uint *)&pBVar32->field_0x34 = *(uint *)&pBVar32->field_0x34 & uVar34;
                }
                uVar34 = *(uint *)(&pBVar16[1].field_0x60 + (long)(pBVar39 + -1));
                if ((uVar34 != 0) &&
                   (*(uint *)&pBVar32->field_0x30 = *(uint *)&pBVar32->field_0x30 & uVar34,
                   (pBVar32->field_0x24 & 0x10) != 0)) {
                  *(uint *)&pBVar32->field_0x34 = *(uint *)&pBVar32->field_0x34 & uVar34;
                }
                if (3 < bVar10) goto LAB_0012613c;
                if (((uVar14 & 0x40008) == 0) &&
                   (*(uint *)((long)(&pBVar16->_formatOptions + -7) + uVar37 * 4 + 8) != 0)) {
                  *(uint *)&pBVar32->field_0x38 =
                       *(uint *)&pBVar32->field_0x38 |
                       *(uint *)((long)(&pBVar16->_formatOptions + -7) + uVar37 * 4 + 8);
                }
                pBVar39 = (BaseRAPass *)&pBVar39->field_0x20;
                pBVar29 = local_2e8;
              } while (this != pBVar39);
            }
            if ((char)((Array<unsigned_short,_2UL> *)&(pBVar29->super_FuncPass).super_Pass._name)->
                      _data[0] == '\x12') {
              pFVar6 = local_330->_func;
              bVar19 = *(byte *)((long)&pBVar29->_logger + 5);
              bVar10 = (pFVar6->_frame)._callStackAlignment;
              if (bVar19 < bVar10) {
                bVar19 = bVar10;
              }
              (pFVar6->_frame)._callStackAlignment = bVar19;
              bVar10 = (pFVar6->_frame)._finalStackAlignment;
              if (bVar19 < bVar10) {
                bVar19 = bVar10;
              }
              (pFVar6->_frame)._finalStackAlignment = bVar19;
            }
            pBVar30 = (BaseRAPass *)&pBVar16->field_0x1c;
            uVar34 = -(uint)((int)(*(uint *)pBVar30 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000));
            uVar14 = -(uint)((int)(*(uint *)&pBVar16->field_0x20 ^ 0x80000000) <
                            (int)(uVar13 ^ 0x80000000));
            uVar41 = -(uint)((int)(*(uint *)&pBVar16->field_0x24 ^ 0x80000000) <
                            (int)(uVar31 ^ 0x80000000));
            uVar44 = -(uint)((int)(*(uint *)&pBVar16->field_0x28 ^ 0x80000000) <
                            (int)(uVar49 ^ 0x80000000));
            uVar12 = uVar12 & uVar34 | ~uVar34 & *(uint *)pBVar30;
            uVar13 = uVar13 & uVar14 | ~uVar14 & *(uint *)&pBVar16->field_0x20;
            uVar31 = uVar31 & uVar41 | ~uVar41 & *(uint *)&pBVar16->field_0x24;
            uVar49 = uVar49 & uVar44 | ~uVar44 & *(uint *)&pBVar16->field_0x28;
            uVar38 = (ulong)((int)uVar38 + 2);
            pBVar16 = (BaseRAPass *)local_318._32_8_;
          }
          if (pBVar29 == pBVar16) goto LAB_00125f8a;
          pBVar29 = *(BaseRAPass **)&(pBVar29->super_FuncPass).super_Pass._cb;
          if (pBVar29 == (BaseRAPass *)0x0) goto LAB_0012618c;
        } while( true );
      }
      goto LAB_001261b4;
    }
    goto LAB_001261af;
  }
LAB_00125fea:
  uVar12 = *(uint *)&local_330->field_0x148;
  lVar35 = *(long *)&(local_330->_workRegs).field_0x0;
  pBVar16 = (BaseRAPass *)0x0;
  do {
    if (pBVar16 == (BaseRAPass *)(ulong)uVar12) goto LAB_001261a0;
    lVar40 = *(long *)(lVar35 + (long)pBVar16 * 8);
    fVar43 = 0.0;
    if ((ulong)*(uint *)(lVar40 + 0x58) == 0) {
LAB_00126067:
      uVar13 = 0;
    }
    else {
      lVar25 = 0;
      uVar13 = 0;
      do {
        uVar13 = (uVar13 + *(int *)(*(long *)(lVar40 + 0x50) + 4 + lVar25)) -
                 *(int *)(*(long *)(lVar40 + 0x50) + lVar25);
        lVar25 = lVar25 + 0xc;
      } while ((ulong)*(uint *)(lVar40 + 0x58) * 0xc != lVar25);
      if (uVar13 == 0) goto LAB_00126067;
      fVar43 = (float)((double)*(uint *)(lVar40 + 0x78) / (double)uVar13);
    }
    *(uint *)(lVar40 + 0x60) = uVar13;
    *(float *)(lVar40 + 100) = fVar43;
    bVar10 = *(byte *)(*(long *)(lVar40 + 8) + 0xe);
    this_01 = (BaseRAPass *)(ulong)bVar10;
    *(float *)(lVar40 + 0x68) = (float)bVar10 * 0.01 + fVar43;
    pBVar16 = (BaseRAPass *)((long)&(pBVar16->super_FuncPass).super_Pass._vptr_Pass + 1);
  } while (pBVar16 != local_2d8);
  if (local_2e0 != (BaseRAPass *)0x0) {
    pBStack_350 = (BaseRAPass *)0x1260b3;
    String::clear((String *)&local_258);
    pBStack_350 = (BaseRAPass *)0x1260c0;
    _dumpLiveSpans(local_330,(String *)&local_258);
    pBVar32 = (BaseRAPass *)auStack_257._23_8_;
    if ((byte)local_258 < 0x1f) {
LAB_001260fe:
      pBVar32 = (BaseRAPass *)auStack_257;
    }
    pBStack_350 = (BaseRAPass *)0x126111;
    (*(local_2e0->super_FuncPass).super_Pass._vptr_Pass[2])(local_2e0,pBVar32);
    pBVar42 = local_338;
  }
  pBStack_350 = (BaseRAPass *)0x126126;
  ZoneVector<unsigned_int>::release((ZoneVector<unsigned_int> *)local_2b8,(ZoneAllocator *)pBVar42);
LAB_00126126:
  EVar11 = 0;
LAB_00125258:
  pBStack_350 = (BaseRAPass *)0x125265;
  String::reset((String *)&local_258);
  return EVar11;
}

Assistant:

ASMJIT_FAVOR_SPEED Error BaseRAPass::buildLiveness() noexcept {
#ifndef ASMJIT_NO_LOGGING
  Logger* logger = getLoggerIf(DiagnosticOptions::kRADebugLiveness);
  StringTmp<512> sb;
#endif

  ASMJIT_RA_LOG_FORMAT("[BuildLiveness]\n");

  uint32_t i;

  uint32_t numAllBlocks = blockCount();
  uint32_t numReachableBlocks = reachableBlockCount();

  uint32_t numWorkRegs = workRegCount();
  uint32_t numBitWords = ZoneBitVector::_wordsPerBits(numWorkRegs);

  if (!numWorkRegs) {
    ASMJIT_RA_LOG_FORMAT("  Done (no virtual registers)\n");
    return kErrorOk;
  }

  ZoneVector<uint32_t> nUsesPerWorkReg; // Number of USEs of each RAWorkReg.
  ZoneVector<uint32_t> nOutsPerWorkReg; // Number of OUTs of each RAWorkReg.
  ZoneVector<uint32_t> nInstsPerBlock;  // Number of instructions of each RABlock.

  ASMJIT_PROPAGATE(nUsesPerWorkReg.resize(allocator(), numWorkRegs));
  ASMJIT_PROPAGATE(nOutsPerWorkReg.resize(allocator(), numWorkRegs));
  ASMJIT_PROPAGATE(nInstsPerBlock.resize(allocator(), numAllBlocks));

  // Calculate GEN/KILL of Each Block
  // --------------------------------

  for (i = 0; i < numReachableBlocks; i++) {
    RABlock* block = _pov[i];
    ASMJIT_PROPAGATE(block->resizeLiveBits(numWorkRegs));

    BaseNode* node = block->last();
    BaseNode* stop = block->first();

    uint32_t nInsts = 0;
    for (;;) {
      if (node->isInst()) {
        InstNode* inst = node->as<InstNode>();
        RAInst* raInst = inst->passData<RAInst>();
        ASMJIT_ASSERT(raInst != nullptr);

        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t count = raInst->tiedCount();

        for (uint32_t j = 0; j < count; j++) {
          RATiedReg* tiedReg = &tiedRegs[j];
          uint32_t workId = tiedReg->workId();

          // Update `nUses` and `nOuts`.
          nUsesPerWorkReg[workId] += 1u;
          nOutsPerWorkReg[workId] += uint32_t(tiedReg->isWrite());

          // Mark as:
          //   KILL - if this VirtReg is killed afterwards.
          //   LAST - if this VirtReg is last in this basic block.
          if (block->kill().bitAt(workId))
            tiedReg->addFlags(RATiedFlags::kKill);
          else if (!block->gen().bitAt(workId))
            tiedReg->addFlags(RATiedFlags::kLast);

          if (tiedReg->isWriteOnly()) {
            // KILL.
            block->kill().setBit(workId, true);
          }
          else {
            // GEN.
            block->kill().setBit(workId, false);
            block->gen().setBit(workId, true);
          }

          if (tiedReg->isLeadConsecutive()) {
            RAWorkReg* workReg = workRegById(workId);
            workReg->markLeadConsecutive();
          }

          if (tiedReg->hasConsecutiveParent()) {
            RAWorkReg* consecutiveParentReg = workRegById(tiedReg->consecutiveParent());
            ASMJIT_PROPAGATE(consecutiveParentReg->addImmediateConsecutive(allocator(), workId));
          }
        }

        nInsts++;
      }

      if (node == stop)
        break;

      node = node->prev();
      ASMJIT_ASSERT(node != nullptr);
    }

    nInstsPerBlock[block->blockId()] = nInsts;
  }

  // Calculate IN/OUT of Each Block
  // ------------------------------

#ifndef ASMJIT_NO_LOGGING
  uint32_t numVisits = numReachableBlocks;
#endif

  {
    ZoneStack<RABlock*> workList;
    ZoneBitVector workBits;

    ASMJIT_PROPAGATE(workList.init(allocator()));
    ASMJIT_PROPAGATE(workBits.resize(allocator(), blockCount(), true));

    for (i = 0; i < numReachableBlocks; i++) {
      RABlock* block = _pov[i];
      LiveOps::recalcInOut(block, numBitWords, true);
      ASMJIT_PROPAGATE(workList.append(block));
    }

    while (!workList.empty()) {
      RABlock* block = workList.popFirst();
      uint32_t blockId = block->blockId();

      workBits.setBit(blockId, false);
      if (LiveOps::recalcInOut(block, numBitWords)) {
        const RABlocks& predecessors = block->predecessors();
        uint32_t numPredecessors = predecessors.size();

        for (uint32_t j = 0; j < numPredecessors; j++) {
          RABlock* pred = predecessors[j];
          if (!workBits.bitAt(pred->blockId())) {
            workBits.setBit(pred->blockId(), true);
            ASMJIT_PROPAGATE(workList.append(pred));
          }
        }
      }
#ifndef ASMJIT_NO_LOGGING
      numVisits++;
#endif
    }

    workList.reset();
    workBits.release(allocator());
  }

  ASMJIT_RA_LOG_COMPLEX({
    logger->logf("  LiveIn/Out Done (%u visits)\n", numVisits);
    for (i = 0; i < numAllBlocks; i++) {
      RABlock* block = _blocks[i];

      ASMJIT_PROPAGATE(sb.assignFormat("  {#%u}\n", block->blockId()));
      ASMJIT_PROPAGATE(_dumpBlockLiveness(sb, block));

      logger->log(sb);
    }
  });

  // Reserve the space in each `RAWorkReg` for references
  // ----------------------------------------------------

  for (i = 0; i < numWorkRegs; i++) {
    RAWorkReg* workReg = workRegById(i);
    ASMJIT_PROPAGATE(workReg->_refs.reserve(allocator(), nUsesPerWorkReg[i]));
    ASMJIT_PROPAGATE(workReg->_writes.reserve(allocator(), nOutsPerWorkReg[i]));
  }

  // These are not needed anymore, so release the memory now so other allocations can reuse it.
  nUsesPerWorkReg.release(allocator());
  nOutsPerWorkReg.release(allocator());

  // Assign block and instruction positions, build LiveCount and LiveSpans
  // ---------------------------------------------------------------------

  // This is a starting position, reserving [0, 1] for function arguments.
  uint32_t position = 2;

  for (i = 0; i < numAllBlocks; i++) {
    RABlock* block = _blocks[i];
    if (!block->isReachable())
      continue;

    uint32_t blockId = block->blockId();

    BaseNode* node = block->first();
    BaseNode* stop = block->last();

    uint32_t endPosition = position + nInstsPerBlock[i] * 2;
    block->setFirstPosition(position);
    block->setEndPosition(endPosition);

    RALiveCount curLiveCount;
    RALiveCount maxLiveCount;

    // Process LIVE-IN.
    ZoneBitVector::ForEachBitSet it(block->liveIn());
    while (it.hasNext()) {
      RAWorkReg* workReg = _workRegs[uint32_t(it.next())];
      curLiveCount[workReg->group()]++;
      ASMJIT_PROPAGATE(workReg->liveSpans().openAt(allocator(), position, endPosition));
    }

    for (;;) {
      if (node->isInst()) {
        InstNode* inst = node->as<InstNode>();
        RAInst* raInst = inst->passData<RAInst>();

        // Impossible - each processed instruction node must have an associated RAInst.
        ASMJIT_ASSERT(raInst != nullptr);

        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t count = raInst->tiedCount();

        inst->setPosition(position);
        raInst->_liveCount = curLiveCount;

        for (uint32_t j = 0; j < count; j++) {
          RATiedReg* tiedReg = &tiedRegs[j];
          uint32_t workId = tiedReg->workId();

          // Create refs and writes.
          RAWorkReg* workReg = workRegById(workId);
          workReg->_refs.appendUnsafe(node);
          if (tiedReg->isWrite()) {
            workReg->_writes.appendUnsafe(node);
          }

          if (workReg->singleBasicBlockId() != blockId) {
            workReg->markUseOfMultipleBasicBlocks();
          }

          // We couldn't calculate this in previous steps, but since we know all LIVE-OUT at this point it becomes
          // trivial. If this is the last instruction that uses this `workReg` and it's not LIVE-OUT then it is
          // KILLed here.
          if (tiedReg->isLast() && !block->liveOut().bitAt(workId)) {
            tiedReg->addFlags(RATiedFlags::kKill);
          }

          LiveRegSpans& liveSpans = workReg->liveSpans();
          bool wasOpen;
          ASMJIT_PROPAGATE(liveSpans.openAt(allocator(), position + !tiedReg->isRead(), endPosition, wasOpen));

          RegGroup group = workReg->group();
          if (!wasOpen) {
            curLiveCount[group]++;
            raInst->_liveCount[group]++;
          }

          if (tiedReg->isKill()) {
            liveSpans.closeAt(position + !tiedReg->isRead() + 1);
            curLiveCount[group]--;
          }

          // Update `RAWorkReg::useIdMask` and `RAWorkReg::hintRegId`.
          if (tiedReg->hasUseId()) {
            uint32_t useId = tiedReg->useId();
            workReg->addUseIdMask(Support::bitMask(useId));
            if (!workReg->hasHintRegId() && !Support::bitTest(raInst->_clobberedRegs[group], useId)) {
              workReg->setHintRegId(useId);
            }
          }

          if (tiedReg->useRegMask()) {
            workReg->restrictPreferredMask(tiedReg->useRegMask());
            if (workReg->isLeadConsecutive()) {
              workReg->restrictConsecutiveMask(tiedReg->useRegMask());
            }
          }

          if (tiedReg->outRegMask()) {
            workReg->restrictPreferredMask(tiedReg->outRegMask());
            if (workReg->isLeadConsecutive()) {
              workReg->restrictConsecutiveMask(tiedReg->outRegMask());
            }
          }

          // Update `RAWorkReg::clobberedSurvivalMask`.
          if (raInst->_clobberedRegs[group] && !tiedReg->isOutOrKill()) {
            workReg->addClobberSurvivalMask(raInst->_clobberedRegs[group]);
          }
        }

        if (node->isInvoke()) {
          func()->frame().updateCallStackAlignment(node->as<InvokeNode>()->detail().naturalStackAlignment());
        }

        position += 2;
        maxLiveCount.op<Support::Max>(raInst->_liveCount);
      }

      if (node == stop)
        break;

      node = node->next();
      ASMJIT_ASSERT(node != nullptr);
    }

    block->_maxLiveCount = maxLiveCount;
    _globalMaxLiveCount.op<Support::Max>(maxLiveCount);
    ASMJIT_ASSERT(position == block->endPosition());
  }

  // Calculate WorkReg statistics
  // ----------------------------

  for (i = 0; i < numWorkRegs; i++) {
    RAWorkReg* workReg = _workRegs[i];

    LiveRegSpans& spans = workReg->liveSpans();
    uint32_t width = spans.width();
    float freq = width ? float(double(workReg->_refs.size()) / double(width)) : float(0);

    RALiveStats& stats = workReg->liveStats();
    stats._width = width;
    stats._freq = freq;
    stats._priority = freq + float(int(workReg->virtReg()->weight())) * 0.01f;
  }

  ASMJIT_RA_LOG_COMPLEX({
    sb.clear();
    _dumpLiveSpans(sb);
    logger->log(sb);
  });

  nInstsPerBlock.release(allocator());

  return kErrorOk;
}